

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cc
# Opt level: O2

bool LessThan(string *left,string *right)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  bVar1 = std::operator<(left,right);
  if (bVar1) {
    std::operator+(&local_80,"\"",left);
    std::operator+(&local_c0,&local_80,"\" < \"");
    std::operator+(&local_a0,&local_c0,right);
    std::operator+(&local_40,&local_a0,"\"");
    LogText::Log(&local_40);
    this = &local_40;
  }
  else {
    std::operator+(&local_80,"\"",left);
    std::operator+(&local_c0,&local_80,"\" >= \"");
    std::operator+(&local_a0,&local_c0,right);
    std::operator+(&local_60,&local_a0,"\"");
    LogText::Log(&local_60);
    this = &local_60;
  }
  std::__cxx11::string::~string((string *)this);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_80);
  return bVar1;
}

Assistant:

bool LessThan(const std::string& left, const std::string& right) {
  if (left < right) {
    LogText::Log("\"" + left + "\" < \"" + right + "\"");
    return true;
  } else {
    LogText::Log("\"" + left + "\" >= \"" + right + "\"");
    return false;
  }
}